

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_TextureMapping::HasMatchingTextureCoordinates
          (ON_TextureMapping *this,ON_MappingTag *tag,ON_Xform *mesh_xform)

{
  double dVar1;
  ON__UINT32 OVar2;
  double (*padVar3) [4];
  bool bVar4;
  ON__UINT32 OVar5;
  int local_3c;
  ON_Xform *pOStack_38;
  int i;
  double *b;
  double *a;
  bool rc;
  ON_Xform *mesh_xform_local;
  ON_MappingTag *tag_local;
  ON_TextureMapping *this_local;
  
  a._7_1_ = false;
  OVar2 = tag->m_mapping_crc;
  OVar5 = MappingCRC(this);
  if ((((OVar2 == OVar5) && (a._7_1_ = true, this->m_type != srfp_mapping)) &&
      (mesh_xform != (ON_Xform *)0x0)) &&
     (((bVar4 = ON_Xform::IsValid(mesh_xform), bVar4 &&
       (bVar4 = ON_Xform::IsZero(mesh_xform), !bVar4)) &&
      (bVar4 = ON_Xform::IsZero(&tag->m_mesh_xform), !bVar4)))) {
    local_3c = 0x10;
    pOStack_38 = &tag->m_mesh_xform;
    b = (double *)mesh_xform;
    do {
      if (local_3c == 0) {
        return true;
      }
      dVar1 = *b;
      padVar3 = pOStack_38->m_xform;
      local_3c = local_3c + -1;
      pOStack_38 = (ON_Xform *)(pOStack_38->m_xform[0] + 1);
      b = b + 1;
    } while (ABS(dVar1 - (*padVar3)[0]) <= 1.490116119385e-08);
    a._7_1_ = false;
  }
  return a._7_1_;
}

Assistant:

bool ON_TextureMapping::HasMatchingTextureCoordinates(
       const ON_MappingTag& tag,
       const ON_Xform* mesh_xform
       ) const
{
  bool rc = false;

  // DO NOT COMPARE m_mapping_id's in this function.
  // This function returns true if the tc values
  // calculated by the mapping will be the same
  // as the mapping that was used to set the tag.
  if ( tag.m_mapping_crc == MappingCRC() )
  {
    rc = true;

    // zero transformations indicate the mapping
    // values are independent of the 3d location
    // of the mesh.  The ON_TextureMapping::TYPE::srfp_mapping != m_type
    // check is used because these mappings are
    // always independent of 3d location but
    // the transformations are often set.
    if ( ON_TextureMapping::TYPE::srfp_mapping != m_type
         && mesh_xform
         && mesh_xform->IsValid()
         && !mesh_xform->IsZero()
         && !tag.m_mesh_xform.IsZero()
       )
    {
      // compare xforms - these can have a bit of slop
      const double* a = &mesh_xform->m_xform[0][0];
      const double* b = &tag.m_mesh_xform.m_xform[0][0];
      for ( int i = 16; i--; /*empty*/ )
      {
        if ( fabs(*a++ - *b++) > ON_SQRT_EPSILON )
        {
          rc = false;
          break;
        }
      }
    }
  }

  return rc;
}